

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O3

void * threadTask(void *arg)

{
  pthread_spinlock_t *__lock;
  bool bVar1;
  adt_buf_err_t aVar2;
  int iVar3;
  void *local_48;
  uint local_40;
  soa_t *local_38;
  
  if (arg != (void *)0x0) {
    iVar3 = sem_wait((sem_t *)((long)arg + 0x10));
    if (iVar3 == 0) {
      __lock = (pthread_spinlock_t *)((long)arg + 8);
      local_38 = (soa_t *)((long)arg + 0x58);
      do {
        pthread_spin_lock(__lock);
        aVar2 = adt_rbfh_remove((adt_rbfh_t *)((long)arg + 0x30),(uint8_t *)&local_48);
        if ((aVar2 == '\0') && (local_48 != (void *)0x0)) {
          if ((ulong)local_40 < 0x21) {
            soa_free(local_38,local_48,(ulong)local_40);
            bVar1 = true;
            goto LAB_00122818;
          }
          pthread_spin_unlock(__lock);
          free(local_48);
        }
        else {
          bVar1 = false;
LAB_00122818:
          pthread_spin_unlock(__lock);
          if (!bVar1) {
            return (void *)0x0;
          }
          if (aVar2 == '\0' && local_48 == (void *)0x0) {
            return (void *)0x0;
          }
        }
        iVar3 = sem_wait((sem_t *)((long)arg + 0x10));
      } while (iVar3 == 0);
    }
    threadTask_cold_1();
  }
  return (void *)0x0;
}

Assistant:

static THREAD_PROTO(threadTask,arg)
{
   if(arg!=0)
   {

      apx_allocator_t *self;
      uint32_t messages_processed=0;
      self = (apx_allocator_t*) arg;
      for(;;)
      {
#ifdef _MSC_VER
         DWORD result = WaitForSingleObject(self->semaphore, INFINITE);
         if (result == WAIT_OBJECT_0)
#else
         int result = sem_wait(&self->semaphore);
         if (result == 0)
#endif
         {
            bool processing_result;
            messages_processed++;
            processing_result = apx_allocator_processEvent(self);
            if (!processing_result)
            {
               break;
            }
         }
         else
         {
#ifdef _MSC_VER
            DWORD lastError = GetLastError();
            APX_LOG_ERROR("[APX_ALLOCATOR]: failure while waiting for semaphore, lastError=%d", lastError);
#else
            APX_LOG_ERROR("[APX_ALLOCATOR]: failure while waiting for semaphore, errno=%d", errno);
#endif
            break;
         }
      }
      //APX_LOG_DEBUG("[APX_ALLOCATOR]: messages_processed: %u\n", messages_processed);
   }
   THREAD_RETURN(0);
}